

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O1

void emit_ff_op(function *fn,int A,int B,int C,int pc,char *op)

{
  TValue *pTVar1;
  
  emit_reg(fn,"ra",A);
  if ((char)B < '\0') {
    pTVar1 = fn->p->k;
    emit_reg_or_k(fn,"rc",C);
    membuff_add_fstring(&fn->body,"setfltvalue(ra, %.17g %s fltvalue(rc));\n",
                        pTVar1[(int)(B & 0xffffff7f)].value_.gc,op);
    return;
  }
  if (-1 < (char)C) {
    emit_reg_or_k(fn,"rb",B);
    emit_reg_or_k(fn,"rc",C);
    membuff_add_fstring(&fn->body,"setfltvalue(ra, fltvalue(rb) %s fltvalue(rc));\n",op);
    return;
  }
  pTVar1 = fn->p->k;
  emit_reg_or_k(fn,"rb",B);
  membuff_add_fstring(&fn->body,"setfltvalue(ra, fltvalue(rb) %s %.17g);\n",
                      pTVar1[(int)(C & 0xffffff7f)].value_.gc,op);
  return;
}

Assistant:

void emit_ff_op(struct function *fn, int A, int B, int C, int pc, const char *op) {
  (void)pc;
  emit_reg(fn, "ra", A);
  if (ISK(B)) {
    TValue *Konst1 = &fn->p->k[INDEXK(B)];
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setfltvalue(ra, %.17g %s fltvalue(rc));\n", Konst1->value_.n, op);
  }
  else if (ISK(C)) {
    TValue *Konst1 = &fn->p->k[INDEXK(C)];
    emit_reg_or_k(fn, "rb", B);
    membuff_add_fstring(&fn->body, "setfltvalue(ra, fltvalue(rb) %s %.17g);\n", op, Konst1->value_.n);
  }
  else {
    emit_reg_or_k(fn, "rb", B);
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setfltvalue(ra, fltvalue(rb) %s fltvalue(rc));\n", op);
  }
}